

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::EltwiseParameter::ByteSizeLong(EltwiseParameter *this)

{
  UnknownFieldSet *unknown_fields;
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar1 = 0;
  }
  else {
    unknown_fields = EltwiseParameter::unknown_fields(this);
    sVar1 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  sVar1 = sVar1 + (ulong)(uint)(this->coeff_).current_size_ * 5;
  if ((uVar3 & 3) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->operation_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    sVar1 = sVar1 + (uVar3 & 2);
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t EltwiseParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.EltwiseParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float coeff = 2;
  {
    unsigned int count = this->coeff_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->coeff_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional .caffe.EltwiseParameter.EltwiseOp operation = 1 [default = SUM];
    if (has_operation()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->operation());
    }

    // optional bool stable_prod_grad = 3 [default = true];
    if (has_stable_prod_grad()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}